

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::eval(completion *__return_storage_ptr__,impl *this,statement *s)

{
  bool bVar1;
  int iVar2;
  version vVar3;
  source_extend *e_00;
  global_object *this_00;
  completion local_138 [3];
  native_error_exception *e;
  undefined1 local_21;
  syntax_node *local_20;
  statement *s_local;
  impl *this_local;
  completion *res;
  
  local_20 = &s->super_syntax_node;
  s_local = (statement *)this;
  this_local = (impl *)__return_storage_ptr__;
  if (this->gc_cooldown_ == 0) {
    iVar2 = gc_heap::use_percentage(this->heap_);
    if (0x5a < iVar2) {
      gc_heap::garbage_collect(this->heap_);
      this->gc_cooldown_ = 1000;
    }
  }
  else {
    this->gc_cooldown_ = this->gc_cooldown_ + -1;
  }
  local_21 = 0;
  completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
  e_00 = syntax_node::extend(local_20);
  current_extend(this,e_00);
  this_00 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  vVar3 = global_object::language_version(this_00);
  if ((int)vVar3 < 1) {
    accept<mjs::interpreter::impl>(local_138,(statement *)local_20,this);
    completion::operator=(__return_storage_ptr__,local_138);
    completion::~completion(local_138);
  }
  else {
    accept<mjs::interpreter::impl>((completion *)&e,(statement *)local_20,this);
    completion::operator=(__return_storage_ptr__,(completion *)&e);
    completion::~completion((completion *)&e);
  }
  bVar1 = std::function::operator_cast_to_bool((function *)&this->on_statement_executed_);
  if (bVar1) {
    std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::operator()
              (&this->on_statement_executed_,(statement *)local_20,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

completion eval(const statement& s) {
        if (!gc_cooldown_) {
            if (heap_.use_percentage() > 90) {
                heap_.garbage_collect();
                gc_cooldown_ = 1000; // Arbitrary, but avoid collecting all the time when close to full
            }
        } else {
            --gc_cooldown_;
        }

        completion res{};

        current_extend(s.extend());

        if (global_->language_version() >= version::es3) {
            try {
                res = accept(s, *this);
            } catch (const native_error_exception& e) {
                res = completion{value{e.make_error_object(global_)}, completion_type::throw_};
            }
        } else {
            res = accept(s, *this);
        }
        if (on_statement_executed_) {
            on_statement_executed_(s, res);
        }
        return res;
    }